

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cxx
# Opt level: O2

RegularExpression * __thiscall
cmsys::RegularExpression::operator=(RegularExpression *this,RegularExpression *rxp)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  
  if (this != rxp) {
    if (rxp->program == (char *)0x0) {
      this->program = (char *)0x0;
    }
    else {
      iVar1 = rxp->progsize;
      this->progsize = iVar1;
      if (this->program != (char *)0x0) {
        operator_delete__(this->program);
        iVar1 = this->progsize;
      }
      pcVar2 = (char *)operator_new__((long)iVar1);
      this->program = pcVar2;
      uVar3 = (long)iVar1;
      while (uVar3 != 0) {
        this->program[uVar3 - 1] = rxp->program[uVar3 - 1];
        uVar3 = uVar3 - 1;
      }
      memcpy(this,rxp,0x208);
      pcVar2 = rxp->regmust;
      this->regmust = pcVar2;
      if (pcVar2 != (char *)0x0) {
        this->regmust = this->program + (uint)((int)pcVar2 - *(int *)&rxp->program);
      }
      this->regstart = rxp->regstart;
      this->reganch = rxp->reganch;
      this->regmlen = rxp->regmlen;
    }
  }
  return this;
}

Assistant:

RegularExpression& RegularExpression::operator=(const RegularExpression& rxp)
{
  if (this == &rxp) {
    return *this;
  }
  if (!rxp.program) {
    this->program = nullptr;
    return *this;
  }
  int ind;
  this->progsize = rxp.progsize; // Copy regular expression size
  delete[] this->program;
  this->program = new char[this->progsize]; // Allocate storage
  for (ind = this->progsize; ind-- != 0;)   // Copy regular expression
    this->program[ind] = rxp.program[ind];
  // Copy pointers into last successful "find" operation
  this->regmatch = rxp.regmatch;
  this->regmust = rxp.regmust; // Copy field
  if (rxp.regmust != nullptr) {
    char* dum = rxp.program;
    ind = 0;
    while (dum != rxp.regmust) {
      ++dum;
      ++ind;
    }
    this->regmust = this->program + ind;
  }
  this->regstart = rxp.regstart; // Copy starting index
  this->reganch = rxp.reganch;   // Copy remaining private data
  this->regmlen = rxp.regmlen;   // Copy remaining private data

  return *this;
}